

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.h
# Opt level: O0

bool __thiscall
Assimp::STransformVecInfo::operator==(STransformVecInfo *this,STransformVecInfo *other)

{
  double dVar1;
  STransformVecInfo *other_local;
  STransformVecInfo *this_local;
  
  dVar1 = std::fabs((double)(ulong)(uint)((this->super_aiUVTransform).mTranslation.x -
                                         (other->super_aiUVTransform).mTranslation.x));
  if ((0.05 < SUB84(dVar1,0)) ||
     (dVar1 = std::fabs((double)(ulong)(uint)((this->super_aiUVTransform).mTranslation.y -
                                             (other->super_aiUVTransform).mTranslation.y)),
     0.05 < SUB84(dVar1,0))) {
    return false;
  }
  dVar1 = std::fabs((double)(ulong)(uint)((this->super_aiUVTransform).mScaling.x -
                                         (other->super_aiUVTransform).mScaling.x));
  if ((SUB84(dVar1,0) <= 0.05) &&
     (dVar1 = std::fabs((double)(ulong)(uint)((this->super_aiUVTransform).mScaling.y -
                                             (other->super_aiUVTransform).mScaling.y)),
     SUB84(dVar1,0) <= 0.05)) {
    dVar1 = std::fabs((double)(ulong)(uint)((this->super_aiUVTransform).mRotation -
                                           (other->super_aiUVTransform).mRotation));
    if (0.05 < SUB84(dVar1,0)) {
      return false;
    }
    return true;
  }
  return false;
}

Assistant:

inline bool operator== (const STransformVecInfo& other) const
    {
        // We use a small epsilon here
        const static float epsilon = 0.05f;

        if (std::fabs( mTranslation.x - other.mTranslation.x ) > epsilon ||
            std::fabs( mTranslation.y - other.mTranslation.y ) > epsilon)
        {
            return false;
        }

        if (std::fabs( mScaling.x - other.mScaling.x ) > epsilon ||
            std::fabs( mScaling.y - other.mScaling.y ) > epsilon)
        {
            return false;
        }

        if (std::fabs( mRotation - other.mRotation) > epsilon)
        {
            return false;
        }
        return true;
    }